

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int spi_open(int pi,uint channel,uint speed,uint32_t flags)

{
  int iVar1;
  uint32_t flags_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &flags_local;
  ext[0].size = 4;
  flags_local = flags;
  iVar1 = pigpio_command_ext(pi,0x47,channel,speed,4,1,ext,1);
  return iVar1;
}

Assistant:

int spi_open(int pi, unsigned channel, unsigned speed, uint32_t flags)
{
   gpioExtent_t ext[1];

   /*
   p1=channel
   p2=speed
   p3=4
   ## extension ##
   uint32_t flags
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &flags;

   return pigpio_command_ext
      (pi, PI_CMD_SPIO, channel, speed, 4, 1, ext, 1);
}